

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QString.cpp
# Opt level: O0

bool __thiscall QToken::operator==(QToken *this,QToken *other)

{
  bool bVar1;
  
  bVar1 = std::operator==(&this->opts_,&other->opts_);
  return bVar1;
}

Assistant:

bool QToken::operator==(const QToken &other) const {
    return opts_ == other.opts_;
}